

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

PClass * __thiscall ATeleportFog::StaticType(ATeleportFog *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

void ATeleportFog::PostBeginPlay ()
{
	Super::PostBeginPlay ();
	S_Sound (this, CHAN_BODY, "misc/teleport", 1, ATTN_NORM);
	switch (gameinfo.gametype)
	{
	case GAME_Hexen:
	case GAME_Heretic:
		SetState(FindState(NAME_Raven));
		break;

	case GAME_Strife:
		SetState(FindState(NAME_Strife));
		break;
		
	default:
		break;
	}
}